

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miscellaneous-algorithms.hpp
# Opt level: O0

Matrix4 * stateObservation::kine::vector6ToHomogeneousMatrix
                    (Matrix4 *__return_storage_ptr__,Vector6 *v)

{
  Type local_180;
  Type local_148;
  Type local_110;
  Type local_d8;
  Vector3 local_a0;
  AngleAxis local_88;
  Matrix3 local_68;
  CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>
  local_1b;
  DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *local_18;
  Vector6 *v_local;
  Matrix4 *M;
  
  local_18 = (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)v;
  v_local = (Vector6 *)__return_storage_ptr__;
  Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::Identity();
  Eigen::Matrix<double,4,4,0,4,4>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,4,4,0,4,4>>>
            ((Matrix<double,4,4,0,4,4> *)__return_storage_ptr__,&local_1b);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::tail<int>(&local_d8,local_18,3);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::VectorBlock<Eigen::Matrix<double,6,1,0,6,1>const,_1>>
            ((Matrix<double,3,1,0,3,1> *)&local_a0,&local_d8);
  rotationVectorToAngleAxis(&local_88,&local_a0);
  Eigen::AngleAxis<double>::toRotationMatrix(&local_68,&local_88);
  Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::block<int,int>
            (&local_110,(DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)__return_storage_ptr__,0,0,3,3
            );
  Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false> *)&local_110,
             (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&local_68);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>(&local_148,local_18,3);
  Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::block<int,int>
            (&local_180,(DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)__return_storage_ptr__,0,3,3,1
            );
  Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false> *)&local_180,
             (DenseBase<Eigen::Block<const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
             &local_148);
  return __return_storage_ptr__;
}

Assistant:

inline Matrix4 vector6ToHomogeneousMatrix(const Vector6 & v)
        {
            Matrix4 M(Matrix4::Identity());
            M.block(0,0,3,3) = rotationVectorToAngleAxis(Vector3(v.tail(3)))
                                .toRotationMatrix();
            M.block(0,3,3,1) = v.head(3);
            return M;
        }